

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void bitset_shift_right(bitset_t *bitset,size_t s)

{
  ulong uVar1;
  uint64_t *puVar2;
  byte bVar3;
  size_t sVar4;
  long lVar5;
  size_t newarraysize;
  ulong uVar6;
  
  uVar6 = s >> 6;
  uVar1 = bitset->arraysize;
  if ((s & 0x3f) == 0) {
    newarraysize = uVar1 - uVar6;
    if (newarraysize != 0) {
      puVar2 = bitset->array;
      sVar4 = newarraysize;
      do {
        *puVar2 = puVar2[uVar6];
        puVar2 = puVar2 + 1;
        sVar4 = sVar4 - 1;
      } while (sVar4 != 0);
    }
  }
  else {
    bVar3 = (byte)s & 0x3f;
    puVar2 = bitset->array;
    if (uVar6 + 1 < uVar1) {
      lVar5 = 0;
      do {
        puVar2[lVar5] =
             puVar2[uVar6 + lVar5 + 1] << (0x40 - ((byte)s & 0x3f) & 0x3f) |
             puVar2[uVar6 + lVar5] >> bVar3;
        lVar5 = lVar5 + 1;
      } while (~uVar6 + uVar1 != lVar5);
    }
    newarraysize = uVar1 - uVar6;
    puVar2[newarraysize - 1] = puVar2[uVar1 - 1] >> bVar3;
  }
  bitset_resize(bitset,newarraysize,false);
  return;
}

Assistant:

void bitset_shift_right(bitset_t *bitset, size_t s) {
    size_t extra_words = s / 64;
    int inword_shift = s % 64;
    size_t as = bitset->arraysize;
    if (inword_shift == 0) {
        // could be done with a memmove
        for (size_t i = 0; i < as - extra_words; i++) {
            bitset->array[i] = bitset->array[i + extra_words];
        }
        bitset_resize(bitset, as - extra_words, false);

    } else {
        for (size_t i = 0; i + extra_words + 1 < as; i++) {
            bitset->array[i] =
                (bitset->array[i + extra_words] >> inword_shift) |
                (bitset->array[i + extra_words + 1] << (64 - inword_shift));
        }
        bitset->array[as - extra_words - 1] =
            (bitset->array[as - 1] >> inword_shift);
        bitset_resize(bitset, as - extra_words, false);
    }
}